

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTcSymMetaclass::gen_code_new
          (CTcSymMetaclass *this,int discard,int argc,int varargs,CTcNamedArgs *named_args,
          int is_transient)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  int in_ECX;
  size_t __n;
  int in_EDX;
  void *__buf;
  void *__buf_00;
  int in_ESI;
  CTcGenTarg *in_RDI;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  
  if (((ulong)*(CTcPrsMem **)&in_RDI->max_sp_depth_ & 1) == 0) {
    if (in_ECX != 0) {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    }
    if ((in_RDI->meta_cnt_ < 0x100) && (in_EDX < 0x100)) {
      __n = 0xc2;
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)in_EDX,__buf,__n);
      CTcDataStream::write
                (&G_cs->super_CTcDataStream,(int)(char)in_RDI->meta_cnt_,__buf_00,0x46b538);
    }
    else {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      CTcDataStream::write2((CTcDataStream *)in_RDI,in_stack_ffffffffffffffcc);
      CTcDataStream::write2((CTcDataStream *)in_RDI,in_stack_ffffffffffffffcc);
    }
    CTcGenTarg::note_pop(G_cg,in_EDX);
    CTcGenTarg::post_call_cleanup
              (in_RDI,(CTcNamedArgs *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
    ;
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
      CTcGenTarg::note_push((CTcGenTarg *)0x2d9602);
    }
  }
  else {
    sVar2 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x2d94b0);
    uVar1 = (uint)sVar2;
    pcVar3 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x2d94be);
    CTcTokenizer::log_error(0x2d2d,(ulong)uVar1,pcVar3);
  }
  return;
}

Assistant:

void CTcSymMetaclass::gen_code_new(int discard, int argc,
                                   int varargs, CTcNamedArgs *named_args,
                                   int is_transient)
{
    /* if this is an external metaclass, we can't generate code */
    if (ext_)
    {
        G_tok->log_error(TCERR_EXT_METACLASS, (int)get_sym_len(), get_sym());
        return;
    }

    /* if we have varargs, write the modifier */
    if (varargs)
        G_cg->write_op(OPC_VARARGC);
    
    if (meta_idx_ <= 255 && argc <= 255)
    {
        G_cg->write_op(is_transient ? OPC_TRNEW1 : OPC_NEW1);
        G_cs->write((char)argc);
        G_cs->write((char)meta_idx_);
    }
    else
    {
        G_cg->write_op(is_transient ? OPC_TRNEW1 : OPC_NEW2);
        G_cs->write2(argc);
        G_cs->write2(meta_idx_);
    }

    /* new1/new2 remove arguments */
    G_cg->note_pop(argc);

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if we're not discarding the value, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}